

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeString::~UnicodeString(UnicodeString *this)

{
  char16_t *pcVar1;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003f7be0
  ;
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x4) !=
      (undefined1  [56])0x0) {
    LOCK();
    pcVar1 = (this->fUnion).fFields.fArray + -2;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    UNLOCK();
    if (*(int *)pcVar1 == 0) {
      uprv_free_63((this->fUnion).fFields.fArray + -2);
    }
  }
  UObject::~UObject((UObject *)this);
  return;
}

Assistant:

UnicodeString::~UnicodeString()
{
#ifdef UNISTR_COUNT_FINAL_STRING_LENGTHS
  // Count lengths of strings at the end of their lifetime.
  // Useful for discussion of a desirable stack buffer size.
  // Count the contents length, not the optional NUL terminator nor further capacity.
  // Ignore open-buffer strings and strings which alias external storage.
  if((fUnion.fFields.fLengthAndFlags&(kOpenGetBuffer|kReadonlyAlias|kWritableAlias)) == 0) {
    if(hasShortLength()) {
      umtx_atomic_inc(finalLengthCounts + getShortLength());
    } else {
      umtx_atomic_inc(&beyondCount);
    }
  }
#endif

  releaseArray();
}